

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelSuite.cpp
# Opt level: O3

bool __thiscall
Test::ParallelSuite::run
          (ParallelSuite *this,Output *out,
          vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *selectedMethods,
          bool continueOnError)

{
  string *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  SynchronizedOutput *this_01;
  future<bool> *result;
  _Alloc_hider this_02;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> results;
  undefined1 local_12c [4];
  undefined8 local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *local_118;
  ParallelSuite *local_110;
  ParallelSuite *local_108;
  undefined8 local_100;
  Assertion local_f8;
  
  (this->super_Suite).continueAfterFail = continueOnError;
  local_118 = selectedMethods;
  this_01 = (SynchronizedOutput *)operator_new(0x38);
  SynchronizedOutput::SynchronizedOutput(this_01,out);
  (this->super_Suite).output = (Output *)this_01;
  psVar1 = &(this->super_Suite).suiteName;
  (*out->_vptr_Output[2])
            (out,psVar1,
             (ulong)(uint)((int)((ulong)((long)(this->super_Suite).testMethods.
                                               super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->super_Suite).testMethods.
                                              super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                          -0x55555555));
  iVar4 = (*(this->super_Suite)._vptr_Suite[5])(this);
  if ((char)iVar4 != '\0') {
    if ((this->super_Suite).testMethods.
        super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->super_Suite).testMethods.
        super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Assertion::Assertion
                (&local_f8,(psVar1->_M_dataplus)._M_p,0,
                 "Any test-methods directly added to a parallel-suite are not executed!");
      (*out->_vptr_Output[8])(out,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.userMessage._M_dataplus._M_p != &local_f8.userMessage.field_2) {
        operator_delete(local_f8.userMessage._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.errorMessage._M_dataplus._M_p != &local_f8.errorMessage.field_2) {
        operator_delete(local_f8.errorMessage._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.args._M_dataplus._M_p != &local_f8.args.field_2) {
        operator_delete(local_f8.args._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.method._M_dataplus._M_p != &local_f8.method.field_2) {
        operator_delete(local_f8.method._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.file._M_dataplus._M_p != &local_f8.file.field_2) {
        operator_delete(local_f8.file._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.suite._M_dataplus._M_p != &local_f8.suite.field_2) {
        operator_delete(local_f8.suite._M_dataplus._M_p);
      }
    }
    (*(this->super_Suite)._vptr_Suite[6])(this);
  }
  (*out->_vptr_Output[3])
            (out,psVar1,
             (ulong)(uint)((int)((ulong)((long)(this->super_Suite).testMethods.
                                               super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->super_Suite).testMethods.
                                              super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                          -0x55555555),0,0);
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::vector
            ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)&local_f8,
             (long)(this->super_Suite).subSuites.
                   super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_Suite).subSuites.
                   super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_128);
  local_12c = (undefined1  [4])0x0;
  this_02._M_p = local_f8.suite._M_dataplus._M_p;
  if ((this->super_Suite).subSuites.
      super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_Suite).subSuites.
      super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      local_108 = (ParallelSuite *)runSuite;
      local_100 = 0;
      local_110 = this;
      std::
      async<bool(Test::ParallelSuite::*)(unsigned_int,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>const&),Test::ParallelSuite*,unsigned_int&,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>const&>
                ((launch)&local_128,(offset_in_ParallelSuite_to_subr *)0x1,&local_108,
                 (uint *)&local_110,
                 (vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *)local_12c);
      p_Var3 = p_Stack_120;
      uVar2 = local_128;
      local_128 = 0;
      p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 (local_f8.suite._M_dataplus._M_p + (ulong)(uint)local_12c * 0x10 + 8);
      *(undefined8 *)(local_f8.suite._M_dataplus._M_p + (ulong)(uint)local_12c * 0x10) = uVar2;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       (local_f8.suite._M_dataplus._M_p + (ulong)(uint)local_12c * 0x10 + 8) = p_Var3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
      }
      local_12c = (undefined1  [4])((int)local_12c + 1);
      this_02._M_p = local_f8.suite._M_dataplus._M_p;
    } while ((ulong)(uint)local_12c <
             (ulong)((long)(this->super_Suite).subSuites.
                           super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_Suite).subSuites.
                           super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  for (; this_02._M_p != (pointer)local_f8.suite._M_string_length;
      this_02._M_p = (pointer)((long)this_02._M_p + 0x10)) {
    std::future<bool>::get((future<bool> *)this_02._M_p);
  }
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector
            ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)&local_f8);
  return true;
}

Assistant:

bool ParallelSuite::run(Output &out, const std::vector<TestMethodInfo> &selectedMethods, bool continueOnError) {
  this->continueAfterFail = continueOnError;
  this->output = new SynchronizedOutput(out);
  out.initializeSuite(suiteName, static_cast<unsigned>(testMethods.size()));
  if (setup()) {
    // warn if test-methods are directly added
    if (!testMethods.empty()) {
      Assertion notEmptyAssterion(
          suiteName.c_str(), 0, "Any test-methods directly added to a parallel-suite are not executed!");
      out.printFailure(notEmptyAssterion);
    }
    // run tear-down after all tests
    tear_down();
  }
  out.finishSuite(suiteName, static_cast<unsigned>(testMethods.size()), 0, std::chrono::microseconds::zero());

  std::vector<std::future<bool>> results(subSuites.size());
  // run sub-suites
  for (unsigned int i = 0; i < subSuites.size(); i++) {
    results[i] = std::async(std::launch::async, &ParallelSuite::runSuite, this, i, selectedMethods);
  }

  // join sub-suites
  for (std::future<bool> &result : results) {
    result.get();
  }

  return true;
}